

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluPixelTransfer.cpp
# Opt level: O2

void glu::readPixels(RenderContext *context,int x,int y,PixelBufferAccess *dst)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  TransferFormat TVar6;
  InternalError *this;
  
  iVar4 = (*context->_vptr_RenderContext[3])();
  if ((dst->super_ConstPixelBufferAccess).m_size.m_data[2] == 1) {
    iVar1 = (dst->super_ConstPixelBufferAccess).m_pitch.m_data[1];
    iVar5 = tcu::TextureFormat::getPixelSize((TextureFormat *)dst);
    iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
    if (iVar1 == iVar5 * iVar2) {
      iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
      TVar6 = getTransferFormat((dst->super_ConstPixelBufferAccess).m_format);
      pcVar3 = *(code **)(CONCAT44(extraout_var,iVar4) + 0xff0);
      iVar5 = getTransferAlignment((dst->super_ConstPixelBufferAccess).m_format);
      (*pcVar3)(0xd05,iVar5);
      (**(code **)(CONCAT44(extraout_var,iVar4) + 0x1220))
                (x,y,iVar2,iVar1,(ulong)TVar6 & 0xffffffff,(ulong)TVar6 >> 0x20,
                 (dst->super_ConstPixelBufferAccess).m_data);
      return;
    }
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,(char *)0x0,"dst.getRowPitch() == dst.getFormat().getPixelSize()*dst.getWidth()"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
               ,0x36);
  }
  else {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,(char *)0x0,"dst.getDepth() == 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluPixelTransfer.cpp"
               ,0x35);
  }
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void readPixels (const RenderContext& context, int x, int y, const tcu::PixelBufferAccess& dst)
{
	const glw::Functions& gl = context.getFunctions();

	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	TCU_CHECK_INTERNAL(dst.getRowPitch() == dst.getFormat().getPixelSize()*dst.getWidth());

	int				width		= dst.getWidth();
	int				height		= dst.getHeight();
	TransferFormat	format		= getTransferFormat(dst.getFormat());

	gl.pixelStorei(GL_PACK_ALIGNMENT, getTransferAlignment(dst.getFormat()));
	gl.readPixels(x, y, width, height, format.format, format.dataType, dst.getDataPtr());
}